

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsDemuxer.cpp
# Opt level: O0

void __thiscall
TSDemuxer::TSDemuxer(TSDemuxer *this,BufferedReaderManager *readManager,char *streamName)

{
  int iVar1;
  AbstractReader *pAVar2;
  VodCoreException *this_00;
  string local_1c8;
  ostringstream local_1a8 [8];
  ostringstream ss;
  char *streamName_local;
  BufferedReaderManager *readManager_local;
  TSDemuxer *this_local;
  
  AbstractDemuxer::AbstractDemuxer(&this->super_AbstractDemuxer);
  (this->super_AbstractDemuxer)._vptr_AbstractDemuxer = (_func_int **)&PTR__TSDemuxer_00442580;
  this->m_readManager = readManager;
  std::__cxx11::string::string((string *)&this->m_streamName);
  std::__cxx11::string::string((string *)&this->m_streamNameLow);
  std::map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>::map
            (&this->m_lastPesPts);
  std::map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>::map
            (&this->m_lastPesDts);
  std::map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>::map
            (&this->m_firstPtsTime);
  std::map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>::map
            (&this->m_firstDtsTime);
  std::map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>::map
            (&this->m_fullPtsTime);
  std::map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>::map
            (&this->m_fullDtsTime);
  this->m_curPos = (uint8_t *)0x0;
  this->m_pmtPid = 0;
  this->m_codecReady = false;
  this->m_readCnt = 0;
  this->m_dataProcessed = 0;
  this->m_notificated = false;
  TS_program_map_section::TS_program_map_section(&this->m_pmt);
  this->m_tmpBuffer[0xb0] = '\0';
  this->m_tmpBuffer[0xb1] = '\0';
  this->m_tmpBuffer[0xb2] = '\0';
  this->m_tmpBuffer[0xb3] = '\0';
  this->m_tmpBuffer[0xb4] = '\0';
  this->m_tmpBuffer[0xb5] = '\0';
  this->m_tmpBuffer[0xb6] = '\0';
  this->m_tmpBuffer[0xb7] = '\0';
  this->m_tmpBuffer[0xb8] = '\0';
  this->m_tmpBuffer[0xb9] = '\0';
  this->m_tmpBuffer[0xba] = '\0';
  this->m_tmpBuffer[0xbb] = '\0';
  this->m_tmpBuffer[0xbc] = '\0';
  this->m_tmpBuffer[0xbd] = '\0';
  this->m_tmpBuffer[0xbe] = '\0';
  this->m_tmpBuffer[0xbf] = '\0';
  this->m_tmpBuffer[0xa0] = '\0';
  this->m_tmpBuffer[0xa1] = '\0';
  this->m_tmpBuffer[0xa2] = '\0';
  this->m_tmpBuffer[0xa3] = '\0';
  this->m_tmpBuffer[0xa4] = '\0';
  this->m_tmpBuffer[0xa5] = '\0';
  this->m_tmpBuffer[0xa6] = '\0';
  this->m_tmpBuffer[0xa7] = '\0';
  this->m_tmpBuffer[0xa8] = '\0';
  this->m_tmpBuffer[0xa9] = '\0';
  this->m_tmpBuffer[0xaa] = '\0';
  this->m_tmpBuffer[0xab] = '\0';
  this->m_tmpBuffer[0xac] = '\0';
  this->m_tmpBuffer[0xad] = '\0';
  this->m_tmpBuffer[0xae] = '\0';
  this->m_tmpBuffer[0xaf] = '\0';
  this->m_tmpBuffer[0x90] = '\0';
  this->m_tmpBuffer[0x91] = '\0';
  this->m_tmpBuffer[0x92] = '\0';
  this->m_tmpBuffer[0x93] = '\0';
  this->m_tmpBuffer[0x94] = '\0';
  this->m_tmpBuffer[0x95] = '\0';
  this->m_tmpBuffer[0x96] = '\0';
  this->m_tmpBuffer[0x97] = '\0';
  this->m_tmpBuffer[0x98] = '\0';
  this->m_tmpBuffer[0x99] = '\0';
  this->m_tmpBuffer[0x9a] = '\0';
  this->m_tmpBuffer[0x9b] = '\0';
  this->m_tmpBuffer[0x9c] = '\0';
  this->m_tmpBuffer[0x9d] = '\0';
  this->m_tmpBuffer[0x9e] = '\0';
  this->m_tmpBuffer[0x9f] = '\0';
  this->m_tmpBuffer[0x80] = '\0';
  this->m_tmpBuffer[0x81] = '\0';
  this->m_tmpBuffer[0x82] = '\0';
  this->m_tmpBuffer[0x83] = '\0';
  this->m_tmpBuffer[0x84] = '\0';
  this->m_tmpBuffer[0x85] = '\0';
  this->m_tmpBuffer[0x86] = '\0';
  this->m_tmpBuffer[0x87] = '\0';
  this->m_tmpBuffer[0x88] = '\0';
  this->m_tmpBuffer[0x89] = '\0';
  this->m_tmpBuffer[0x8a] = '\0';
  this->m_tmpBuffer[0x8b] = '\0';
  this->m_tmpBuffer[0x8c] = '\0';
  this->m_tmpBuffer[0x8d] = '\0';
  this->m_tmpBuffer[0x8e] = '\0';
  this->m_tmpBuffer[0x8f] = '\0';
  this->m_tmpBuffer[0x70] = '\0';
  this->m_tmpBuffer[0x71] = '\0';
  this->m_tmpBuffer[0x72] = '\0';
  this->m_tmpBuffer[0x73] = '\0';
  this->m_tmpBuffer[0x74] = '\0';
  this->m_tmpBuffer[0x75] = '\0';
  this->m_tmpBuffer[0x76] = '\0';
  this->m_tmpBuffer[0x77] = '\0';
  this->m_tmpBuffer[0x78] = '\0';
  this->m_tmpBuffer[0x79] = '\0';
  this->m_tmpBuffer[0x7a] = '\0';
  this->m_tmpBuffer[0x7b] = '\0';
  this->m_tmpBuffer[0x7c] = '\0';
  this->m_tmpBuffer[0x7d] = '\0';
  this->m_tmpBuffer[0x7e] = '\0';
  this->m_tmpBuffer[0x7f] = '\0';
  this->m_tmpBuffer[0x60] = '\0';
  this->m_tmpBuffer[0x61] = '\0';
  this->m_tmpBuffer[0x62] = '\0';
  this->m_tmpBuffer[99] = '\0';
  this->m_tmpBuffer[100] = '\0';
  this->m_tmpBuffer[0x65] = '\0';
  this->m_tmpBuffer[0x66] = '\0';
  this->m_tmpBuffer[0x67] = '\0';
  this->m_tmpBuffer[0x68] = '\0';
  this->m_tmpBuffer[0x69] = '\0';
  this->m_tmpBuffer[0x6a] = '\0';
  this->m_tmpBuffer[0x6b] = '\0';
  this->m_tmpBuffer[0x6c] = '\0';
  this->m_tmpBuffer[0x6d] = '\0';
  this->m_tmpBuffer[0x6e] = '\0';
  this->m_tmpBuffer[0x6f] = '\0';
  this->m_tmpBuffer[0x50] = '\0';
  this->m_tmpBuffer[0x51] = '\0';
  this->m_tmpBuffer[0x52] = '\0';
  this->m_tmpBuffer[0x53] = '\0';
  this->m_tmpBuffer[0x54] = '\0';
  this->m_tmpBuffer[0x55] = '\0';
  this->m_tmpBuffer[0x56] = '\0';
  this->m_tmpBuffer[0x57] = '\0';
  this->m_tmpBuffer[0x58] = '\0';
  this->m_tmpBuffer[0x59] = '\0';
  this->m_tmpBuffer[0x5a] = '\0';
  this->m_tmpBuffer[0x5b] = '\0';
  this->m_tmpBuffer[0x5c] = '\0';
  this->m_tmpBuffer[0x5d] = '\0';
  this->m_tmpBuffer[0x5e] = '\0';
  this->m_tmpBuffer[0x5f] = '\0';
  this->m_tmpBuffer[0x40] = '\0';
  this->m_tmpBuffer[0x41] = '\0';
  this->m_tmpBuffer[0x42] = '\0';
  this->m_tmpBuffer[0x43] = '\0';
  this->m_tmpBuffer[0x44] = '\0';
  this->m_tmpBuffer[0x45] = '\0';
  this->m_tmpBuffer[0x46] = '\0';
  this->m_tmpBuffer[0x47] = '\0';
  this->m_tmpBuffer[0x48] = '\0';
  this->m_tmpBuffer[0x49] = '\0';
  this->m_tmpBuffer[0x4a] = '\0';
  this->m_tmpBuffer[0x4b] = '\0';
  this->m_tmpBuffer[0x4c] = '\0';
  this->m_tmpBuffer[0x4d] = '\0';
  this->m_tmpBuffer[0x4e] = '\0';
  this->m_tmpBuffer[0x4f] = '\0';
  this->m_tmpBuffer[0x30] = '\0';
  this->m_tmpBuffer[0x31] = '\0';
  this->m_tmpBuffer[0x32] = '\0';
  this->m_tmpBuffer[0x33] = '\0';
  this->m_tmpBuffer[0x34] = '\0';
  this->m_tmpBuffer[0x35] = '\0';
  this->m_tmpBuffer[0x36] = '\0';
  this->m_tmpBuffer[0x37] = '\0';
  this->m_tmpBuffer[0x38] = '\0';
  this->m_tmpBuffer[0x39] = '\0';
  this->m_tmpBuffer[0x3a] = '\0';
  this->m_tmpBuffer[0x3b] = '\0';
  this->m_tmpBuffer[0x3c] = '\0';
  this->m_tmpBuffer[0x3d] = '\0';
  this->m_tmpBuffer[0x3e] = '\0';
  this->m_tmpBuffer[0x3f] = '\0';
  this->m_tmpBuffer[0x20] = '\0';
  this->m_tmpBuffer[0x21] = '\0';
  this->m_tmpBuffer[0x22] = '\0';
  this->m_tmpBuffer[0x23] = '\0';
  this->m_tmpBuffer[0x24] = '\0';
  this->m_tmpBuffer[0x25] = '\0';
  this->m_tmpBuffer[0x26] = '\0';
  this->m_tmpBuffer[0x27] = '\0';
  this->m_tmpBuffer[0x28] = '\0';
  this->m_tmpBuffer[0x29] = '\0';
  this->m_tmpBuffer[0x2a] = '\0';
  this->m_tmpBuffer[0x2b] = '\0';
  this->m_tmpBuffer[0x2c] = '\0';
  this->m_tmpBuffer[0x2d] = '\0';
  this->m_tmpBuffer[0x2e] = '\0';
  this->m_tmpBuffer[0x2f] = '\0';
  this->m_tmpBuffer[0x10] = '\0';
  this->m_tmpBuffer[0x11] = '\0';
  this->m_tmpBuffer[0x12] = '\0';
  this->m_tmpBuffer[0x13] = '\0';
  this->m_tmpBuffer[0x14] = '\0';
  this->m_tmpBuffer[0x15] = '\0';
  this->m_tmpBuffer[0x16] = '\0';
  this->m_tmpBuffer[0x17] = '\0';
  this->m_tmpBuffer[0x18] = '\0';
  this->m_tmpBuffer[0x19] = '\0';
  this->m_tmpBuffer[0x1a] = '\0';
  this->m_tmpBuffer[0x1b] = '\0';
  this->m_tmpBuffer[0x1c] = '\0';
  this->m_tmpBuffer[0x1d] = '\0';
  this->m_tmpBuffer[0x1e] = '\0';
  this->m_tmpBuffer[0x1f] = '\0';
  this->m_tmpBuffer[0] = '\0';
  this->m_tmpBuffer[1] = '\0';
  this->m_tmpBuffer[2] = '\0';
  this->m_tmpBuffer[3] = '\0';
  this->m_tmpBuffer[4] = '\0';
  this->m_tmpBuffer[5] = '\0';
  this->m_tmpBuffer[6] = '\0';
  this->m_tmpBuffer[7] = '\0';
  this->m_tmpBuffer[8] = '\0';
  this->m_tmpBuffer[9] = '\0';
  this->m_tmpBuffer[10] = '\0';
  this->m_tmpBuffer[0xb] = '\0';
  this->m_tmpBuffer[0xc] = '\0';
  this->m_tmpBuffer[0xd] = '\0';
  this->m_tmpBuffer[0xe] = '\0';
  this->m_tmpBuffer[0xf] = '\0';
  std::vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>::vector(&this->m_mplsInfo);
  this->m_firstPCRTime = -1;
  pAVar2 = BufferedReaderManager::getReader(this->m_readManager,streamName);
  this->m_bufferedReader = pAVar2;
  iVar1 = (*this->m_bufferedReader->_vptr_AbstractReader[6])();
  this->m_readerID = iVar1;
  if (this->m_bufferedReader == (AbstractReader *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::operator<<((ostream *)local_1a8,
                    "TS demuxer can\'t accept reader because this reader does not support BufferedReader interface"
                   );
    this_00 = (VodCoreException *)__cxa_allocate_exception(0x28);
    std::__cxx11::ostringstream::str();
    VodCoreException::VodCoreException(this_00,3,&local_1c8);
    __cxa_throw(this_00,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  this->m_scale = 1;
  this->m_nptPos = 0;
  this->m_tmpBufferLen = 0;
  this->m_m2tsMode = false;
  this->m_lastReadRez = 0;
  this->m_m2tsHdrDiscarded = false;
  this->m_firstPTS = -1;
  this->m_lastPTS = -1;
  this->m_firstVideoPTS = -1;
  this->m_lastVideoPTS = -1;
  this->m_lastVideoDTS = -1;
  this->m_videoDtsGap = -1;
  this->m_firstCall = true;
  this->m_prevFileLen = 0;
  this->m_curFileNum = 0;
  this->m_lastPCRVal = -1;
  this->m_nonMVCVideoFound = false;
  this->m_firstDemuxCall = true;
  memset(this->m_acceptedPidCache,0,0x2000);
  return;
}

Assistant:

TSDemuxer::TSDemuxer(const BufferedReaderManager& readManager, const char* streamName)
    : m_readManager(readManager),
      m_curPos(nullptr),
      m_pmtPid(0),
      m_codecReady(false),
      m_readCnt(0),
      m_dataProcessed(0),
      m_notificated(false),
      m_tmpBuffer{}
{
    m_firstPCRTime = -1;
    m_bufferedReader = m_readManager.getReader(streamName);
    m_readerID = m_bufferedReader->createReader(TS_FRAME_SIZE);
    if (m_bufferedReader == nullptr)
        THROW(ERR_COMMON,
              "TS demuxer can't accept reader because this reader does not support BufferedReader interface")
    m_scale = 1;
    m_nptPos = 0;
    m_tmpBufferLen = 0;
    m_m2tsMode = false;
    m_lastReadRez = 0;
    m_m2tsHdrDiscarded = false;
    m_firstPTS = -1;
    m_lastPTS = -1;
    m_firstVideoPTS = -1;
    m_lastVideoPTS = -1;
    m_lastVideoDTS = -1;
    m_videoDtsGap = -1;
    m_firstCall = true;
    m_prevFileLen = 0;
    m_curFileNum = 0;
    m_lastPCRVal = -1;
    m_nonMVCVideoFound = false;
    m_firstDemuxCall = true;
    memset(m_acceptedPidCache, 0, sizeof(m_acceptedPidCache));
}